

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::FlushExprTreeVector
          (WatWriter *this,
          vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          *expr_trees)

{
  bool bVar1;
  reference pEVar2;
  undefined1 local_58 [8];
  ExprTree expr_tree;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  *__range2;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  *expr_trees_local;
  WatWriter *this_local;
  
  __end2 = std::
           vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           ::begin(expr_trees);
  expr_tree._32_8_ =
       std::
       vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
       ::end(expr_trees);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
                                *)&expr_tree.result_count);
    if (!bVar1) break;
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
             ::operator*(&__end2);
    ExprTree::ExprTree((ExprTree *)local_58,pEVar2);
    FlushExprTree(this,(ExprTree *)local_58);
    ExprTree::~ExprTree((ExprTree *)local_58);
    __gnu_cxx::
    __normal_iterator<const_wabt::(anonymous_namespace)::ExprTree_*,_std::vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void WatWriter::FlushExprTreeVector(const std::vector<ExprTree>& expr_trees) {
  WABT_TRACE_ARGS(FlushExprTreeVector, "%zu", expr_trees.size());
  for (auto expr_tree : expr_trees) {
    FlushExprTree(expr_tree);
  }
}